

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp3_fast(word *pInOut,int iVar,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = (byte)iVar;
  iVar4 = jQ << (bVar1 & 0x1f);
  lVar2 = (long)start;
  iVar3 = start * 100 + 0x14;
  while( true ) {
    if (lVar2 < finish) {
      *pDifStart = 0;
      return 0 << (bVar1 & 0x1f);
    }
    if (0x3f < iVar4) break;
    uVar6 = (SFmask[iVar][iQ] & pInOut[lVar2]) << ((byte)(iQ << (bVar1 & 0x1f)) & 0x3f);
    uVar5 = (pInOut[lVar2] & SFmask[iVar][jQ]) << ((byte)iVar4 & 0x3f);
    if (uVar6 != uVar5) {
      iVar4 = firstShiftWithOneBit(uVar5 ^ uVar6,1 << (bVar1 & 0x1f));
      *pDifStart = iVar3 - iVar4;
      return (uint)(uVar5 < uVar6);
    }
    lVar2 = lVar2 + -1;
    iVar3 = iVar3 + -100;
  }
  __assert_fail("jQ*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0xd3,"int minTemp3_fast(word *, int, int, int, int, int, int *)");
}

Assistant:

int minTemp3_fast(word* pInOut, int iVar, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=start; i>=finish; i--)
    {
        assert( jQ*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) ^ ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) <= ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize)) )
                return 0;
            else
                return 1;
        }
    }
    *pDifStart=0;
    return 0;
}